

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::multalpha
               (void *data,int npixels,DataType dt,int nchannels,int alphachan)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ushort uVar5;
  uint16_t uVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (dt < 4) {
    fVar2 = *(float *)(OneValueInv(Ptex::v2_2::DataType)::one + (ulong)dt * 4);
    switch((ulong)dt) {
    case 0:
      lVar9 = (long)data + (ulong)(alphachan == 0);
      if (npixels * nchannels != 0) {
        lVar7 = npixels * nchannels + lVar9;
        uVar10 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar10 = (ulong)(uint)alphachan;
        }
        do {
          if (0 < (int)uVar10) {
            bVar4 = *(byte *)(lVar9 + (int)(-(uint)(alphachan == 0) | alphachan));
            uVar11 = 0;
            do {
              *(char *)(lVar9 + uVar11) =
                   (char)(int)((float)*(byte *)(lVar9 + uVar11) * (float)bVar4 * fVar2);
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          lVar9 = lVar9 + nchannels;
        } while (lVar9 != lVar7);
      }
      break;
    case 1:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 2);
        uVar10 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar10 = (ulong)(uint)alphachan;
        }
        do {
          if (0 < (int)uVar10) {
            uVar5 = *(ushort *)((long)pvVar8 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2)
            ;
            uVar11 = 0;
            do {
              *(short *)((long)pvVar8 + uVar11 * 2) =
                   (short)(int)((float)*(ushort *)((long)pvVar8 + uVar11 * 2) * (float)uVar5 * fVar2
                               );
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 2);
        } while (pvVar8 != pvVar1);
      }
      break;
    case 2:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
        uVar10 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar10 = (ulong)(uint)alphachan;
        }
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 2);
        do {
          if (0 < (int)uVar10) {
            fVar3 = *(float *)(PtexHalf::h2fTable +
                              (ulong)*(ushort *)
                                      ((long)pvVar8 +
                                      (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2) * 4);
            uVar11 = 0;
            do {
              uVar6 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                                    (ulong)*(ushort *)((long)pvVar8 + uVar11 * 2) *
                                                    4) * fVar3 * fVar2);
              *(uint16_t *)((long)pvVar8 + uVar11 * 2) = uVar6;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 2);
        } while (pvVar8 != pvVar1);
      }
      break;
    case 3:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 4);
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 4);
        uVar10 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar10 = (ulong)(uint)alphachan;
        }
        do {
          if (0 < (int)uVar10) {
            fVar3 = *(float *)((long)pvVar8 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 4);
            uVar11 = 0;
            do {
              *(float *)((long)pvVar8 + uVar11 * 4) =
                   *(float *)((long)pvVar8 + uVar11 * 4) * fVar3 * fVar2;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 4);
        } while (pvVar8 != pvVar1);
      }
    }
  }
  return;
}

Assistant:

void multalpha(void* data, int npixels, DataType dt, int nchannels, int alphachan)
{
    float scale = OneValueInv(dt);
    switch(dt) {
    case dt_uint8:    multalpha(static_cast<uint8_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_uint16:   multalpha(static_cast<uint16_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_half:     multalpha(static_cast<PtexHalf*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_float:    multalpha(static_cast<float*>(data), npixels, nchannels, alphachan, scale); break;
    }
}